

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscParserRoutines.cpp
# Opt level: O3

CNscPStackEntry * NscBuildUnaryOp(int nToken,CNscPStackEntry *pValue)

{
  NscType NVar1;
  uchar *__src;
  size_t *psVar2;
  CNwnDoubleLinkList *pCVar3;
  CNscPStackEntry *pCVar4;
  CNscContext *pCVar5;
  uint uVar6;
  int iVar7;
  CNscPStackEntry *this;
  CNwnDoubleLinkList *pCVar8;
  CNwnDoubleLinkList *pNext;
  CNwnDoubleLinkList *pNext_1;
  char *pcVar9;
  NscPCode nOpCode;
  NscPCodeHeader *pv;
  size_t sVar10;
  float fVar11;
  
  this = CNscContext::GetPStackEntryInt(g_pCtx);
  pCVar5 = g_pCtx;
  if ((g_pCtx->m_fPhase2 == false) && (g_pCtx->m_fNWScript == false)) {
    if (pValue != (CNscPStackEntry *)0x0) {
      pCVar3 = (g_pCtx->m_listEntryFree).m_pPrev;
      pCVar4 = (CNscPStackEntry *)(pValue->m_link).m_pNext;
      if (pCVar4 != pValue) {
        pCVar8 = (pValue->m_link).m_pPrev;
        (pCVar4->m_link).m_pPrev = pCVar8;
        pCVar8->m_pNext = (CNwnDoubleLinkList *)pCVar4;
        (pValue->m_link).m_pNext = &pValue->m_link;
      }
      pCVar8 = &pCVar5->m_listEntryFree;
      if ((CNscPStackEntry *)&pCVar5->m_listEntryFree == pValue) {
        pCVar8 = pCVar3;
      }
      pCVar3 = pCVar8->m_pNext;
      (pValue->m_link).m_pNext = pCVar3;
      (pValue->m_link).m_pPrev = pCVar8;
      pCVar8->m_pNext = &pValue->m_link;
      pCVar3->m_pPrev = &pValue->m_link;
    }
    if (this->m_nType == NscType_Unknown) {
      return this;
    }
    goto LAB_0014c0e2;
  }
  if (pValue == (CNscPStackEntry *)0x0) {
    __assert_fail("pValue",
                  "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscParserRoutines.cpp"
                  ,0xa76,"CNscPStackEntry *NscBuildUnaryOp(int, CNscPStackEntry *)");
  }
  NVar1 = pValue->m_nType;
  if (NVar1 != NscType_Error) {
    if (0x2c < nToken) {
      if (nToken != 0x2d) {
        if (nToken != 0x7e) goto LAB_0014c120;
        if (NVar1 != NscType_Integer) {
          pcVar9 = "~";
          goto LAB_0014bf7e;
        }
        psVar2 = (size_t *)pValue->m_pauchData;
        sVar10 = pValue->m_nDataSize;
        if (g_pCtx->m_fOptExpression != true) {
LAB_0014c020:
          CNscPStackEntry::MakeRoom(this,sVar10);
          memcpy(this->m_pauchData + this->m_nDataSize,psVar2,sVar10);
          this->m_nDataSize = this->m_nDataSize + sVar10;
          nOpCode = NscPCode_BitwiseNot;
          goto LAB_0014c079;
        }
        if (sVar10 == 0) {
          sVar10 = 0;
          goto LAB_0014c020;
        }
        if ((*psVar2 != sVar10) || ((int)psVar2[1] != 0x34)) goto LAB_0014c020;
        uVar6 = CNscPStackEntry::GetInteger(pValue);
        uVar6 = ~uVar6;
LAB_0014bf02:
        CNscPStackEntry::PushConstantInteger(this,uVar6);
LAB_0014c083:
        if (this->m_nType != NscType_Unknown) goto LAB_0014c0e2;
        this->m_nType = NscType_Integer;
        goto LAB_0014bf9d;
      }
      if (NVar1 != NscType_Float) {
        if (NVar1 == NscType_Integer) {
          psVar2 = (size_t *)pValue->m_pauchData;
          sVar10 = pValue->m_nDataSize;
          if (g_pCtx->m_fOptExpression == true) {
            if (sVar10 == 0) {
              sVar10 = 0;
            }
            else if ((*psVar2 == sVar10) && ((int)psVar2[1] == 0x34)) {
              iVar7 = CNscPStackEntry::GetInteger(pValue);
              uVar6 = -iVar7;
              goto LAB_0014bf02;
            }
          }
          CNscPStackEntry::MakeRoom(this,sVar10);
          memcpy(this->m_pauchData + this->m_nDataSize,psVar2,sVar10);
          this->m_nDataSize = this->m_nDataSize + sVar10;
          nOpCode = NscPCode_Negate;
          goto LAB_0014c079;
        }
        pcVar9 = "-";
        goto LAB_0014bf7e;
      }
      psVar2 = (size_t *)pValue->m_pauchData;
      sVar10 = pValue->m_nDataSize;
      if (g_pCtx->m_fOptExpression == true) {
        if (sVar10 == 0) {
          sVar10 = 0;
          goto LAB_0014c09a;
        }
        if ((*psVar2 != sVar10) || ((int)psVar2[1] != 0x34)) goto LAB_0014c09a;
        fVar11 = CNscPStackEntry::GetFloat(pValue);
        CNscPStackEntry::PushConstantFloat(this,-fVar11);
      }
      else {
LAB_0014c09a:
        CNscPStackEntry::MakeRoom(this,sVar10);
        memcpy(this->m_pauchData + this->m_nDataSize,psVar2,sVar10);
        this->m_nDataSize = this->m_nDataSize + sVar10;
        CNscPStackEntry::PushSimpleOp(this,NscPCode_Negate,NscType_Float);
      }
      if (this->m_nType != NscType_Unknown) goto LAB_0014c0e2;
      this->m_nType = NscType_Float;
      goto LAB_0014bf9d;
    }
    if (nToken == 0x21) {
      if (NVar1 == NscType_Integer) {
        psVar2 = (size_t *)pValue->m_pauchData;
        sVar10 = pValue->m_nDataSize;
        if (g_pCtx->m_fOptExpression == true) {
          if (sVar10 == 0) {
            sVar10 = 0;
          }
          else if ((*psVar2 == sVar10) && ((int)psVar2[1] == 0x34)) {
            iVar7 = CNscPStackEntry::GetInteger(pValue);
            uVar6 = (uint)(iVar7 == 0);
            goto LAB_0014bf02;
          }
        }
        CNscPStackEntry::MakeRoom(this,sVar10);
        memcpy(this->m_pauchData + this->m_nDataSize,psVar2,sVar10);
        this->m_nDataSize = this->m_nDataSize + sVar10;
        nOpCode = NscPCode_LogicalNot;
LAB_0014c079:
        CNscPStackEntry::PushSimpleOp(this,nOpCode,NscType_Integer);
        goto LAB_0014c083;
      }
      pcVar9 = "!";
    }
    else {
      if (nToken != 0x2b) {
LAB_0014c120:
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscParserRoutines.cpp"
                      ,0xaf1,"CNscPStackEntry *NscBuildUnaryOp(int, CNscPStackEntry *)");
      }
      if ((NVar1 & ~NscType_Void) == NscType_Integer) {
        __src = pValue->m_pauchData;
        sVar10 = pValue->m_nDataSize;
        CNscPStackEntry::MakeRoom(this,sVar10);
        memcpy(this->m_pauchData + this->m_nDataSize,__src,sVar10);
        this->m_nDataSize = this->m_nDataSize + sVar10;
        if (this->m_nType != NscType_Unknown) goto LAB_0014c0e2;
        this->m_nType = NVar1;
        goto LAB_0014bf9d;
      }
      pcVar9 = "+";
    }
LAB_0014bf7e:
    CNscContext::GenerateMessage(g_pCtx,NscMessage_ErrorOperatorTypeMismatch,pcVar9);
  }
  if (this->m_nType != NscType_Unknown) {
LAB_0014c0e2:
    __assert_fail("m_nType == NscType_Unknown",
                  "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscPStackEntry.h"
                  ,0xee,"void CNscPStackEntry::SetType(NscType)");
  }
  this->m_nType = NscType_Error;
LAB_0014bf9d:
  pCVar5 = g_pCtx;
  pCVar3 = (g_pCtx->m_listEntryFree).m_pPrev;
  pCVar4 = (CNscPStackEntry *)(pValue->m_link).m_pNext;
  if (pCVar4 != pValue) {
    pCVar8 = (pValue->m_link).m_pPrev;
    (pCVar4->m_link).m_pPrev = pCVar8;
    pCVar8->m_pNext = (CNwnDoubleLinkList *)pCVar4;
    (pValue->m_link).m_pNext = &pValue->m_link;
  }
  pCVar8 = &pCVar5->m_listEntryFree;
  if ((CNscPStackEntry *)&pCVar5->m_listEntryFree == pValue) {
    pCVar8 = pCVar3;
  }
  pCVar3 = pCVar8->m_pNext;
  (pValue->m_link).m_pNext = pCVar3;
  (pValue->m_link).m_pPrev = pCVar8;
  pCVar8->m_pNext = &pValue->m_link;
  pCVar3->m_pPrev = &pValue->m_link;
  return this;
}

Assistant:

YYSTYPE NscBuildUnaryOp (int nToken, YYSTYPE pValue)
{
	CNscPStackEntry *pOut = g_pCtx ->GetPStackEntry (__FILE__, __LINE__);

	//
	// If this is phase1 and we are in a function, do nothing
	//

	if (!g_pCtx ->IsPhase2 () && !g_pCtx ->IsNWScript ())
	{
		if (pValue)
			g_pCtx ->FreePStackEntry (pValue);
		pOut ->SetType (NscType_Unknown);
		return pOut;
	}
	
	//
	// Get the value
	//

	assert (pValue);

	//
	// Check for an error
	//

	NscType nType = pValue ->GetType ();
	if (nType == NscType_Error)
	{
		pOut ->SetType (NscType_Error);
	}

	//
	// Process the operator
	//

	else
	{
		switch (nToken)
		{
			case '+': //BIOWARE - Not supported by their compiler
				if (nType == NscType_Integer || 
					nType == NscType_Float)
				{
					pOut ->AppendData (pValue);
					pOut ->SetType (nType);
				}
				else
				{
					g_pCtx ->GenerateMessage (NscMessage_ErrorOperatorTypeMismatch, "+");
					pOut ->SetType (NscType_Error);
				}
				break;

			case '-':
				if (nType == NscType_Integer)
				{
					if (g_pCtx ->GetOptExpression () &&
						pValue ->IsSimpleConstant ())
					{
						pOut ->PushConstantInteger (
							- pValue ->GetInteger ());
						pOut ->SetType (nType);
					}
					else
					{
						pOut ->AppendData (pValue);
						pOut ->PushSimpleOp (NscPCode_Negate, nType);
						pOut ->SetType (nType);
					}
				}
				else if (nType == NscType_Float)
				{
					if (g_pCtx ->GetOptExpression () &&
						pValue ->IsSimpleConstant ())
					{
						pOut ->PushConstantFloat (
							- pValue ->GetFloat ());
						pOut ->SetType (nType);
				}
					else
					{
						pOut ->AppendData (pValue);
						pOut ->PushSimpleOp (NscPCode_Negate, nType);
						pOut ->SetType (nType);
					}
				}
				else
				{
					g_pCtx ->GenerateMessage (NscMessage_ErrorOperatorTypeMismatch, "-");
					pOut ->SetType (NscType_Error);
				}
				break;

			case '~':
				if (nType == NscType_Integer)
				{
					if (g_pCtx ->GetOptExpression () &&
						pValue ->IsSimpleConstant ())
					{
						pOut ->PushConstantInteger (
							~ pValue ->GetInteger ());
						pOut ->SetType (nType);
					}
					else
					{
						pOut ->AppendData (pValue);
						pOut ->PushSimpleOp (NscPCode_BitwiseNot, nType);
						pOut ->SetType (nType);
					}
				}
				else
				{
					g_pCtx ->GenerateMessage (NscMessage_ErrorOperatorTypeMismatch, "~");
					pOut ->SetType (NscType_Error);
				}
				break;

			case '!':
				if (nType == NscType_Integer)
				{
					if (g_pCtx ->GetOptExpression () &&
						pValue ->IsSimpleConstant ())
					{
						pOut ->PushConstantInteger (
							! pValue ->GetInteger ());
						pOut ->SetType (nType);
					}
					else
					{
						pOut ->AppendData (pValue);
						pOut ->PushSimpleOp (NscPCode_LogicalNot, nType);
						pOut ->SetType (nType);
					}
				}
				else
				{
					g_pCtx ->GenerateMessage (NscMessage_ErrorOperatorTypeMismatch, "!");
					pOut ->SetType (NscType_Error);
				}
				break;

			default:
				assert (false);
				g_pCtx ->GenerateMessage (NscMessage_ErrorInternalCompilerError,
					"invalid unary operator");
				pOut ->SetType (NscType_Error);
				break;
		}
	}

	//
	// Rundown
	//

    g_pCtx ->FreePStackEntry (pValue);
	return pOut;
}